

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# localization.cpp
# Opt level: O3

bool __thiscall
CLocalizationDatabase::Load
          (CLocalizationDatabase *this,char *pFilename,IStorage *pStorage,IConsole *pConsole)

{
  char cVar1;
  json_object_entry *pjVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  long lVar5;
  char *pcVar6;
  undefined8 *puVar7;
  json_value *value;
  _json_value *p_Var8;
  char *pcVar9;
  _json_value *p_Var10;
  char *pcVar11;
  ulong uVar12;
  ulong uVar13;
  uint size;
  char cVar14;
  char cVar15;
  _json_value *p_Var16;
  long in_FS_OFFSET;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  json_settings JsonSettings;
  char aError [256];
  char aBuf [256];
  json_settings local_268;
  char local_238 [256];
  char local_138 [256];
  long local_38;
  IOHANDLE io;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (*pFilename == '\0') {
    allocator_default<CLocalizationDatabase::CString>::free_array
              ((this->m_Strings).
               super_array<CLocalizationDatabase::CString,_allocator_default<CLocalizationDatabase::CString>_>
               .list);
    (this->m_Strings).
    super_array<CLocalizationDatabase::CString,_allocator_default<CLocalizationDatabase::CString>_>.
    list_size = 1;
    puVar7 = (undefined8 *)operator_new__(0x20);
    *puVar7 = 1;
    puVar7[2] = 0;
    *(undefined4 *)(puVar7 + 3) = 0;
    (this->m_Strings).
    super_array<CLocalizationDatabase::CString,_allocator_default<CLocalizationDatabase::CString>_>.
    list = (CString *)(puVar7 + 1);
    (this->m_Strings).
    super_array<CLocalizationDatabase::CString,_allocator_default<CLocalizationDatabase::CString>_>.
    num_elements = 0;
    this->m_CurrentVersion = 0;
    bVar3 = true;
  }
  else {
    iVar4 = (*(pStorage->super_IInterface)._vptr_IInterface[4])
                      (pStorage,pFilename,1,0xffffffff,0,0,0,0);
    io = (IOHANDLE)CONCAT44(extraout_var,iVar4);
    if (io == (IOHANDLE)0x0) {
      bVar3 = false;
    }
    else {
      lVar5 = io_length(io);
      size = (uint)lVar5;
      pcVar6 = (char *)mem_alloc(size);
      io_read(io,pcVar6,size);
      io_close(io);
      str_format(local_138,0x100,"loaded \'%s\'",pFilename);
      (*(pConsole->super_IInterface)._vptr_IInterface[0x19])(pConsole,1,"localization",local_138,0);
      allocator_default<CLocalizationDatabase::CString>::free_array
                ((this->m_Strings).
                 super_array<CLocalizationDatabase::CString,_allocator_default<CLocalizationDatabase::CString>_>
                 .list);
      (this->m_Strings).
      super_array<CLocalizationDatabase::CString,_allocator_default<CLocalizationDatabase::CString>_>
      .list_size = 1;
      puVar7 = (undefined8 *)operator_new__(0x20);
      *puVar7 = 1;
      puVar7[2] = 0;
      *(undefined4 *)(puVar7 + 3) = 0;
      (this->m_Strings).
      super_array<CLocalizationDatabase::CString,_allocator_default<CLocalizationDatabase::CString>_>
      .list = (CString *)(puVar7 + 1);
      (this->m_Strings).
      super_array<CLocalizationDatabase::CString,_allocator_default<CLocalizationDatabase::CString>_>
      .num_elements = 0;
      mem_zero(&local_268,0x30);
      value = json_parse_ex(&local_268,pcVar6,(long)(int)size,local_238);
      mem_free(pcVar6);
      bVar3 = value != (json_value *)0x0;
      if (value == (json_value *)0x0) {
        (*(pConsole->super_IInterface)._vptr_IInterface[0x19])(pConsole,1,pFilename,local_238,0);
      }
      else {
        p_Var16 = &json_value_none;
        if ((value->type == json_object) && (uVar13 = (ulong)(value->u).string.length, uVar13 != 0))
        {
          pjVar2 = (value->u).object.values;
          lVar5 = 0;
          do {
            iVar4 = strcmp(*(char **)((long)&pjVar2->name + lVar5),"translated strings");
            if (iVar4 == 0) {
              p_Var16 = *(_json_value **)((long)&pjVar2->value + lVar5);
              goto LAB_00187388;
            }
            lVar5 = lVar5 + 0x18;
          } while (uVar13 * 0x18 != lVar5);
          p_Var16 = &json_value_none;
        }
LAB_00187388:
        if ((p_Var16->type == json_array) && ((p_Var16->u).boolean != 0)) {
          uVar13 = 0;
LAB_001873b8:
          bVar17 = p_Var16->type == json_array;
          bVar19 = -1 < (int)uVar13;
          p_Var8 = &json_value_none;
          if (bVar19 && bVar17) {
            p_Var8 = *(_json_value **)((p_Var16->u).string.ptr + uVar13 * 8);
          }
          p_Var10 = &json_value_none;
          if (p_Var8->type == json_object) {
            uVar12 = (ulong)(p_Var8->u).string.length;
            p_Var10 = &json_value_none;
            if (uVar12 != 0) {
              pjVar2 = (p_Var8->u).object.values;
              lVar5 = 0;
              do {
                pcVar6 = *(char **)((long)&pjVar2->name + lVar5);
                if (((*pcVar6 == 'o') && (pcVar6[1] == 'r')) && (pcVar6[2] == '\0')) {
                  p_Var10 = *(_json_value **)((long)&pjVar2->value + lVar5);
                  goto LAB_00187420;
                }
                lVar5 = lVar5 + 0x18;
              } while (uVar12 * 0x18 != lVar5);
              p_Var10 = &json_value_none;
            }
          }
LAB_00187420:
          pcVar6 = "";
          if (p_Var10->type == json_string) {
            pcVar6 = (p_Var10->u).string.ptr;
          }
          p_Var8 = &json_value_none;
          if (bVar19 && bVar17) {
            p_Var8 = *(_json_value **)((p_Var16->u).string.ptr + uVar13 * 8);
          }
          p_Var10 = &json_value_none;
          if (p_Var8->type == json_object) {
            uVar12 = (ulong)(p_Var8->u).string.length;
            p_Var10 = &json_value_none;
            if (uVar12 != 0) {
              pjVar2 = (p_Var8->u).object.values;
              lVar5 = 0;
              do {
                pcVar11 = *(char **)((long)&pjVar2->name + lVar5);
                if (((*pcVar11 == 't') && (pcVar11[1] == 'r')) && (pcVar11[2] == '\0')) {
                  p_Var10 = *(_json_value **)((long)&pjVar2->value + lVar5);
                  goto LAB_00187489;
                }
                lVar5 = lVar5 + 0x18;
              } while (uVar12 * 0x18 != lVar5);
              p_Var10 = &json_value_none;
            }
          }
LAB_00187489:
          cVar14 = *pcVar6;
          if (cVar14 != '\0') {
            pcVar11 = "";
            if (p_Var10->type == json_string) {
              pcVar11 = (p_Var10->u).string.ptr;
            }
            do {
              cVar15 = *pcVar11;
              if (cVar15 == '\0') break;
              while ((cVar14 != '%' && (cVar14 != '\0'))) {
                pcVar9 = pcVar6 + 1;
                pcVar6 = pcVar6 + 1;
                cVar14 = *pcVar9;
              }
              while ((cVar15 != '\0' && (cVar15 != '%'))) {
                pcVar9 = pcVar11 + 1;
                pcVar11 = pcVar11 + 1;
                cVar15 = *pcVar9;
              }
              if (cVar14 != '\0') {
                if (cVar15 != '\0') {
                  cVar15 = pcVar6[1];
                  cVar1 = pcVar11[1];
                  if (cVar15 == '\0') {
                    if (cVar1 == ' ') break;
                  }
                  else if ((cVar15 == ' ') && (cVar1 == '\0')) break;
                  if (cVar15 == cVar1) goto LAB_00187517;
                }
LAB_0018758f:
                p_Var8 = &json_value_none;
                if (bVar19 && bVar17) {
                  p_Var8 = *(_json_value **)((p_Var16->u).string.ptr + uVar13 * 8);
                }
                p_Var10 = &json_value_none;
                if (p_Var8->type != json_object) goto LAB_00187712;
                uVar12 = (ulong)(p_Var8->u).string.length;
                p_Var10 = &json_value_none;
                if (uVar12 == 0) goto LAB_00187712;
                pjVar2 = (p_Var8->u).object.values;
                lVar5 = 0;
                goto LAB_001875c8;
              }
              if (cVar15 != '\0') goto LAB_0018758f;
LAB_00187517:
              bVar18 = cVar14 != '\0';
              cVar14 = pcVar6[bVar18];
              pcVar6 = pcVar6 + bVar18;
              pcVar11 = pcVar11 + bVar18;
            } while (cVar14 != '\0');
          }
          p_Var8 = &json_value_none;
          if (bVar19 && bVar17) {
            p_Var8 = *(_json_value **)((p_Var16->u).string.ptr + uVar13 * 8);
          }
          p_Var10 = &json_value_none;
          if (p_Var8->type == json_object) {
            uVar12 = (ulong)(p_Var8->u).string.length;
            p_Var10 = &json_value_none;
            if (uVar12 != 0) {
              pjVar2 = (p_Var8->u).object.values;
              lVar5 = 0;
              do {
                pcVar6 = *(char **)((long)&pjVar2->name + lVar5);
                if (((*pcVar6 == 'o') && (pcVar6[1] == 'r')) && (pcVar6[2] == '\0')) {
                  p_Var10 = *(_json_value **)((long)&pjVar2->value + lVar5);
                  goto LAB_001875f7;
                }
                lVar5 = lVar5 + 0x18;
              } while (uVar12 * 0x18 != lVar5);
              p_Var10 = &json_value_none;
            }
          }
LAB_001875f7:
          pcVar6 = "";
          if (p_Var10->type == json_string) {
            pcVar6 = (p_Var10->u).string.ptr;
          }
          p_Var8 = &json_value_none;
          if (bVar19 && bVar17) {
            p_Var8 = *(_json_value **)((p_Var16->u).string.ptr + uVar13 * 8);
          }
          p_Var10 = &json_value_none;
          if (p_Var8->type == json_object) {
            uVar12 = (ulong)(p_Var8->u).string.length;
            p_Var10 = &json_value_none;
            if (uVar12 != 0) {
              pjVar2 = (p_Var8->u).object.values;
              lVar5 = 0;
              do {
                pcVar11 = *(char **)((long)&pjVar2->name + lVar5);
                if (((*pcVar11 == 't') && (pcVar11[1] == 'r')) && (pcVar11[2] == '\0')) {
                  p_Var10 = *(_json_value **)((long)&pjVar2->value + lVar5);
                  goto LAB_0018765d;
                }
                lVar5 = lVar5 + 0x18;
              } while (uVar12 * 0x18 != lVar5);
              p_Var10 = &json_value_none;
            }
          }
LAB_0018765d:
          pcVar11 = "";
          if (p_Var10->type == json_string) {
            pcVar11 = (p_Var10->u).string.ptr;
          }
          p_Var8 = &json_value_none;
          if (bVar19 && bVar17) {
            p_Var8 = *(_json_value **)((p_Var16->u).string.ptr + uVar13 * 8);
          }
          p_Var10 = &json_value_none;
          if (p_Var8->type == json_object) {
            uVar12 = (ulong)(p_Var8->u).string.length;
            p_Var10 = &json_value_none;
            if (uVar12 != 0) {
              pjVar2 = (p_Var8->u).object.values;
              lVar5 = 0;
              do {
                iVar4 = strcmp(*(char **)((long)&pjVar2->name + lVar5),"context");
                if (iVar4 == 0) {
                  p_Var10 = *(_json_value **)((long)&pjVar2->value + lVar5);
                  goto LAB_001876ed;
                }
                lVar5 = lVar5 + 0x18;
              } while (uVar12 * 0x18 != lVar5);
              p_Var10 = &json_value_none;
            }
          }
LAB_001876ed:
          pcVar9 = "";
          if (p_Var10->type == json_string) {
            pcVar9 = (p_Var10->u).string.ptr;
          }
          AddString(this,pcVar6,pcVar11,pcVar9);
          goto LAB_001877c3;
        }
LAB_001877da:
        json_value_free(value);
        iVar4 = this->m_VersionCounter + 1;
        this->m_VersionCounter = iVar4;
        this->m_CurrentVersion = iVar4;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar3;
  while (lVar5 = lVar5 + 0x18, uVar12 * 0x18 != lVar5) {
LAB_001875c8:
    pcVar6 = *(char **)((long)&pjVar2->name + lVar5);
    if (((*pcVar6 == 'o') && (pcVar6[1] == 'r')) && (pcVar6[2] == '\0')) {
      p_Var10 = *(_json_value **)((long)&pjVar2->value + lVar5);
      goto LAB_00187712;
    }
  }
  p_Var10 = &json_value_none;
LAB_00187712:
  pcVar6 = "";
  if (p_Var10->type == json_string) {
    pcVar6 = (p_Var10->u).string.ptr;
  }
  p_Var8 = &json_value_none;
  if (bVar19 && bVar17) {
    p_Var8 = *(_json_value **)((p_Var16->u).string.ptr + uVar13 * 8);
  }
  p_Var10 = &json_value_none;
  if (p_Var8->type == json_object) {
    uVar12 = (ulong)(p_Var8->u).string.length;
    p_Var10 = &json_value_none;
    if (uVar12 != 0) {
      pjVar2 = (p_Var8->u).object.values;
      lVar5 = 0;
      do {
        pcVar11 = *(char **)((long)&pjVar2->name + lVar5);
        if (((*pcVar11 == 't') && (pcVar11[1] == 'r')) && (pcVar11[2] == '\0')) {
          p_Var10 = *(_json_value **)((long)&pjVar2->value + lVar5);
          goto LAB_00187778;
        }
        lVar5 = lVar5 + 0x18;
      } while (uVar12 * 0x18 != lVar5);
      p_Var10 = &json_value_none;
    }
  }
LAB_00187778:
  pcVar11 = "";
  if (p_Var10->type == json_string) {
    pcVar11 = (p_Var10->u).string.ptr;
  }
  str_format(local_138,0x100,"skipping invalid entry or:\'%s\', tr:\'%s\'",pcVar6,pcVar11);
  (*(pConsole->super_IInterface)._vptr_IInterface[0x19])(pConsole,1,"localization",local_138,0);
LAB_001877c3:
  uVar13 = uVar13 + 1;
  if ((p_Var16->u).string.length <= uVar13) goto LAB_001877da;
  goto LAB_001873b8;
}

Assistant:

bool CLocalizationDatabase::Load(const char *pFilename, IStorage *pStorage, IConsole *pConsole)
{
	// empty string means unload
	if(pFilename[0] == 0)
	{
		m_Strings.clear();
		m_CurrentVersion = 0;
		return true;
	}

	// read file data into buffer
	IOHANDLE File = pStorage->OpenFile(pFilename, IOFLAG_READ, IStorage::TYPE_ALL);
	if(!File)
		return false;
	int FileSize = (int)io_length(File);
	char *pFileData = (char *)mem_alloc(FileSize);
	io_read(File, pFileData, FileSize);
	io_close(File);

	// init
	char aBuf[256];
	str_format(aBuf, sizeof(aBuf), "loaded '%s'", pFilename);
	pConsole->Print(IConsole::OUTPUT_LEVEL_ADDINFO, "localization", aBuf);
	m_Strings.clear();

	// parse json data
	json_settings JsonSettings;
	mem_zero(&JsonSettings, sizeof(JsonSettings));
	char aError[256];
	json_value *pJsonData = json_parse_ex(&JsonSettings, pFileData, FileSize, aError);
	mem_free(pFileData);
	
	if(pJsonData == 0)
	{
		pConsole->Print(IConsole::OUTPUT_LEVEL_ADDINFO, pFilename, aError);
		return false;
	}

	// extract data
	const json_value &rStart = (*pJsonData)["translated strings"];
	if(rStart.type == json_array)
	{
		for(unsigned i = 0; i < rStart.u.array.length; ++i)
		{
			bool Valid = true;
			const char *pOr = (const char *)rStart[i]["or"];
			const char *pTr = (const char *)rStart[i]["tr"];
			while(pOr[0] && pTr[0])
			{
				for(; pOr[0] && pOr[0] != '%'; ++pOr);
				for(; pTr[0] && pTr[0] != '%'; ++pTr);
				if(pOr[0] && pTr[0] && ((pOr[1] == ' ' && pTr[1] == 0) || (pOr[1] == 0 && pTr[1] == ' ')))	// skip  false positive
					break;
				if((pOr[0] && (!pTr[0] || pOr[1] != pTr[1])) || (pTr[0] && (!pOr[0] || pTr[1] != pOr[1])))
				{
					Valid = false;
					str_format(aBuf, sizeof(aBuf), "skipping invalid entry or:'%s', tr:'%s'", (const char *)rStart[i]["or"], (const char *)rStart[i]["tr"]);
					pConsole->Print(IConsole::OUTPUT_LEVEL_ADDINFO, "localization", aBuf);
					break;
				}
				if(pOr[0])
					++pOr;
				if(pTr[0])
					++pTr;
			}
			if(Valid)
				AddString((const char *)rStart[i]["or"], (const char *)rStart[i]["tr"], (const char *)rStart[i]["context"]);
		}
	}

	// clean up
	json_value_free(pJsonData);
	m_CurrentVersion = ++m_VersionCounter;
	return true;
}